

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

void __thiscall Units_compareCompatibleUnits_Test::TestBody(Units_compareCompatibleUnits_Test *this)

{
  string *psVar1;
  char cVar2;
  UnitsPtr u2;
  AssertionResult gtest_ar_;
  UnitsPtr u1;
  AssertionResult local_88;
  long local_78 [2];
  long *local_68;
  AssertHelper local_60 [8];
  string *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  long local_48 [2];
  char local_38 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  string *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  libcellml::Units::create();
  psVar1 = local_28;
  local_88._0_8_ = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"u1","");
  libcellml::NamedEntity::setName(psVar1);
  if ((long *)local_88._0_8_ != local_78) {
    operator_delete((void *)local_88._0_8_,local_78[0] + 1);
  }
  local_88._0_8_ = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"milli","");
  local_58 = (string *)local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"");
  libcellml::Units::addUnit((StandardUnit)local_28,(string *)0x10,1.0,1.0,(string *)&local_88);
  if (local_58 != (string *)local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  if ((long *)local_88._0_8_ != local_78) {
    operator_delete((void *)local_88._0_8_,local_78[0] + 1);
  }
  libcellml::Units::create();
  psVar1 = local_58;
  local_88._0_8_ = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"u2","");
  libcellml::NamedEntity::setName(psVar1);
  if ((long *)local_88._0_8_ != local_78) {
    operator_delete((void *)local_88._0_8_,local_78[0] + 1);
  }
  psVar1 = local_58;
  local_88._0_8_ = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"");
  libcellml::Units::addUnit((StandardUnit)psVar1,0x10,1.0,1.0,(string *)0x0);
  if ((long *)local_88._0_8_ != local_78) {
    operator_delete((void *)local_88._0_8_,local_78[0] + 1);
  }
  local_38[0] = libcellml::Units::compatible((shared_ptr *)&local_28,(shared_ptr *)&local_58);
  local_30.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_38[0] == '\0') {
    testing::Message::Message((Message *)&local_68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_88,local_38,"libcellml::Units::compatible(u1, u2)","false");
    testing::internal::AssertHelper::AssertHelper
              (local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x669,(char *)local_88._0_8_);
    testing::internal::AssertHelper::operator=(local_60,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(local_60);
    if ((long *)local_88._0_8_ != local_78) {
      operator_delete((void *)local_88._0_8_,local_78[0] + 1);
    }
    if (local_68 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_68 != (long *)0x0)) {
        (**(code **)(*local_68 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  return;
}

Assistant:

TEST(Units, compareCompatibleUnits)
{
    libcellml::UnitsPtr u1 = libcellml::Units::create();
    u1->setName("u1");
    u1->addUnit(libcellml::Units::StandardUnit::LUX, "milli");

    libcellml::UnitsPtr u2 = libcellml::Units::create();
    u2->setName("u2");
    u2->addUnit(libcellml::Units::StandardUnit::LUX, 0, 1.0, 1.0);

    EXPECT_TRUE(libcellml::Units::compatible(u1, u2));
}